

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableEnumFieldGenerator::GenerateBuilderMembers
          (ImmutableEnumFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  FieldDescriptor *field;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,"private int $name$_ = $default_number$;\n");
  field = this->descriptor_;
  if (*(int *)(*(long *)(field + 0x30) + 0x8c) != 3) {
    WriteFieldDocComment(printer,field);
    io::Printer::Print(printer,variables,
                       "$deprecation$public boolean has$capitalized_name$() {\n  return $get_has_field_bit_builder$;\n}\n"
                      );
    field = this->descriptor_;
    if (*(int *)(*(long *)(field + 0x30) + 0x8c) != 3) goto LAB_002b62cf;
  }
  WriteFieldDocComment(printer,field);
  io::Printer::Print(printer,variables,
                     "$deprecation$public int get$capitalized_name$Value() {\n  return $name$_;\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public Builder set$capitalized_name$Value(int value) {\n  $name$_ = value;\n  $on_changed$\n  return this;\n}\n"
                    );
  field = this->descriptor_;
LAB_002b62cf:
  WriteFieldDocComment(printer,field);
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$ get$capitalized_name$() {\n  $type$ result = $type$.$for_number$($name$_);\n  return result == null ? $unknown$ : result;\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public Builder set$capitalized_name$($type$ value) {\n  if (value == null) {\n    throw new NullPointerException();\n  }\n  $set_has_field_bit_builder$\n  $name$_ = value.getNumber();\n  $on_changed$\n  return this;\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public Builder clear$capitalized_name$() {\n  $clear_has_field_bit_builder$\n  $name$_ = $default_number$;\n  $on_changed$\n  return this;\n}\n"
                    );
  return;
}

Assistant:

void ImmutableEnumFieldGenerator::
GenerateBuilderMembers(io::Printer* printer) const {
  printer->Print(variables_,
    "private int $name$_ = $default_number$;\n");
  if (SupportFieldPresence(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public boolean has$capitalized_name$() {\n"
      "  return $get_has_field_bit_builder$;\n"
      "}\n");
  }
  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public int get$capitalized_name$Value() {\n"
      "  return $name$_;\n"
      "}\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public Builder set$capitalized_name$Value(int value) {\n"
      "  $name$_ = value;\n"
      "  $on_changed$\n"
      "  return this;\n"
      "}\n");
  }
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public $type$ get$capitalized_name$() {\n"
    "  $type$ result = $type$.$for_number$($name$_);\n"
    "  return result == null ? $unknown$ : result;\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder set$capitalized_name$($type$ value) {\n"
    "  if (value == null) {\n"
    "    throw new NullPointerException();\n"
    "  }\n"
    "  $set_has_field_bit_builder$\n"
    "  $name$_ = value.getNumber();\n"
    "  $on_changed$\n"
    "  return this;\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder clear$capitalized_name$() {\n"
    "  $clear_has_field_bit_builder$\n"
    "  $name$_ = $default_number$;\n"
    "  $on_changed$\n"
    "  return this;\n"
    "}\n");
}